

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTexture.h
# Opt level: O2

void __thiscall chrono::ChTexture::ChTexture(ChTexture *this,ChTexture *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  (this->m_scale).m_data[0] = (param_1->m_scale).m_data[0];
  (this->m_scale).m_data[1] = (param_1->m_scale).m_data[1];
  return;
}

Assistant:

class ChApi ChTexture {
  public:
    ChTexture();
    ChTexture(const char* filename);
    ChTexture(const std::string& filename, float scale_x = 1, float scale_y = 1);

    ~ChTexture() {}

    /// Get the texture filename.
    const std::string& GetFilename() const { return m_filename; }

    /// Set the texture filename.
    void SetFilename(const std::string& filename) { m_filename = filename; }

    /// Set the texture scale (in X and Y directions).
    void SetScale(float sx, float sy);

    /// Set the texture scale (in X and Y directions).
    void SetScale(const ChVector2<float>& scale);

    /// Get the texture scales (in X and Y directions)
    float GetScaleX() const { return m_scale.x(); }
    float GetScaleY() const { return m_scale.y(); }

    /// Get the texture scales (in X and Y directions)
    const ChVector2<float>& GetScale() const { return m_scale; }

    /// Method to allow serialization of transient data to archives.
    void ArchiveOUT(ChArchiveOut& marchive);

    /// Method to allow de-serialization of transient data from archives.
    void ArchiveIN(ChArchiveIn& marchive);

  private:
    std::string m_filename;
    ChVector2<float> m_scale;
}